

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

ArrayNew * __thiscall
wasm::Builder::makeArrayNew(Builder *this,HeapType type,Expression *size,Expression *init)

{
  ArrayNew *pAVar1;
  Type local_30;
  
  pAVar1 = MixedArena::alloc<wasm::ArrayNew>((MixedArena *)(this->wasm + 0x158));
  pAVar1->size = size;
  pAVar1->init = init;
  wasm::Type::Type(&local_30,type,NonNullable);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.id =
       local_30.id;
  wasm::ArrayNew::finalize();
  return pAVar1;
}

Assistant:

ArrayNew*
  makeArrayNew(HeapType type, Expression* size, Expression* init = nullptr) {
    auto* ret = wasm.allocator.alloc<ArrayNew>();
    ret->size = size;
    ret->init = init;
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }